

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O1

void __thiscall Assimp::Collada::Mesh::~Mesh(Mesh *this)

{
  pointer puVar1;
  void *pvVar2;
  pointer paVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long lVar6;
  
  std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>::~vector
            (&this->mSubMeshes);
  puVar1 = (this->mFacePosIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->mFacePosIndices).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  puVar1 = (this->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->mFaceSize).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  lVar6 = 0x230;
  do {
    pvVar2 = *(void **)((long)this + lVar6 + -0x10);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&(this->mName)._M_dataplus._M_p + lVar6) - (long)pvVar2
                     );
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0x170);
  lVar6 = 0x170;
  do {
    pvVar2 = *(void **)((long)this + lVar6 + -0x10);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)((long)&(this->mName)._M_dataplus._M_p + lVar6) - (long)pvVar2
                     );
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != 0xb0);
  paVar3 = (this->mBitangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->mBitangents).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  paVar3 = (this->mTangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->mTangents).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  paVar3 = (this->mNormals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->mNormals).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  paVar3 = (this->mPositions).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3,(long)(this->mPositions).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar3);
  }
  std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
  ~vector(&this->mPerVertexData);
  pcVar4 = (this->mVertexID)._M_dataplus._M_p;
  paVar5 = &(this->mVertexID).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->mName)._M_dataplus._M_p;
  paVar5 = &(this->mName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Mesh()
    {
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)
            mNumUVComponents[i] = 2;
    }